

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::isVarCanBeNull(Analyzer *this,Node *node)

{
  size_type sVar1;
  reference pvVar2;
  Node *in_RSI;
  Node *in_RDI;
  int i;
  int local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if (in_RSI == (Node *)0x0) {
    bVar3 = false;
  }
  else if (in_RSI->nodeType == PNT_NULL) {
    bVar3 = true;
  }
  else {
    sVar1 = std::
            vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
            ::size(&nearest_assignments);
    local_1c = (int)sVar1;
    do {
      do {
        local_1c = local_1c + -1;
        if (local_1c < 0) goto LAB_0015513d;
        pvVar2 = std::
                 vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                 ::operator[](&nearest_assignments,(long)local_1c);
      } while (pvVar2->first == (Node *)0x0);
      std::
      vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ::operator[](&nearest_assignments,(long)local_1c);
      bVar3 = isNodeEquals((Analyzer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                           ,in_RDI,in_RSI);
    } while (!bVar3);
    pvVar2 = std::
             vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             ::operator[](&nearest_assignments,(long)local_1c);
    if (((pvVar2->second).first)->nodeType == PNT_NULL) {
      bVar3 = true;
    }
    else {
LAB_0015513d:
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool isVarCanBeNull(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_NULL)
      return true;

    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_NULL)
          return true;
        break;
      }

    return false;
  }